

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode pausewrite(Curl_easy *data,int type,char *ptr,size_t len)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  CURLcode CVar5;
  CURLcode CVar6;
  uint uVar7;
  uint uVar8;
  int *piVar9;
  ulong uVar10;
  bool bVar11;
  
  Curl_http2_stream_pause(data,true);
  uVar2 = (data->state).tempcount;
  if (uVar2 == 0) {
    uVar8 = 0;
  }
  else {
    if ((data->state).tempwrite[0].type == type) {
      bVar11 = true;
      uVar8 = 0;
    }
    else {
      piVar9 = &(data->state).tempwrite[1].type;
      uVar4 = 1;
      do {
        uVar7 = uVar4;
        uVar8 = uVar2;
        if (uVar2 == uVar7) break;
        iVar3 = *piVar9;
        piVar9 = piVar9 + 10;
        uVar4 = uVar7 + 1;
        uVar8 = uVar7;
      } while (iVar3 != type);
      bVar11 = uVar7 < uVar2;
    }
    if (2 < uVar8) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (bVar11) {
      uVar10 = (ulong)uVar8;
      goto LAB_005a1b47;
    }
  }
  uVar10 = (ulong)uVar8;
  Curl_dyn_init(&(data->state).tempwrite[uVar10].b,0x4000000);
  (data->state).tempwrite[uVar10].type = type;
  puVar1 = &(data->state).tempcount;
  *puVar1 = *puVar1 + 1;
LAB_005a1b47:
  CVar5 = Curl_dyn_addn(&(data->state).tempwrite[uVar10].b,ptr,len);
  CVar6 = CURLE_OUT_OF_MEMORY;
  if (CVar5 == CURLE_OK) {
    piVar9 = &(data->req).keepon;
    *(byte *)piVar9 = (byte)*piVar9 | 0x10;
    CVar6 = CURLE_OK;
  }
  return CVar6;
}

Assistant:

static CURLcode pausewrite(struct Curl_easy *data,
                           int type, /* what type of data */
                           const char *ptr,
                           size_t len)
{
  /* signalled to pause sending on this connection, but since we have data
     we want to send we need to dup it to save a copy for when the sending
     is again enabled */
  struct SingleRequest *k = &data->req;
  struct UrlState *s = &data->state;
  unsigned int i;
  bool newtype = TRUE;

  /* If this transfers over HTTP/2, pause the stream! */
  Curl_http2_stream_pause(data, TRUE);

  if(s->tempcount) {
    for(i = 0; i< s->tempcount; i++) {
      if(s->tempwrite[i].type == type) {
        /* data for this type exists */
        newtype = FALSE;
        break;
      }
    }
    DEBUGASSERT(i < 3);
    if(i >= 3)
      /* There are more types to store than what fits: very bad */
      return CURLE_OUT_OF_MEMORY;
  }
  else
    i = 0;

  if(newtype) {
    /* store this information in the state struct for later use */
    Curl_dyn_init(&s->tempwrite[i].b, DYN_PAUSE_BUFFER);
    s->tempwrite[i].type = type;
    s->tempcount++;
  }

  if(Curl_dyn_addn(&s->tempwrite[i].b, (unsigned char *)ptr, len))
    return CURLE_OUT_OF_MEMORY;

  /* mark the connection as RECV paused */
  k->keepon |= KEEP_RECV_PAUSE;

  return CURLE_OK;
}